

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O3

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_short,_10,_true>_>::TestBody
          (UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_short,_10,_true>_> *this)

{
  byte bVar1;
  SEARCH_METHODS *message;
  AssertHelper local_38;
  Message local_30;
  value_type_conflict4 local_28 [4];
  undefined8 *local_20;
  
  local_28[0] = CONCAT11(local_28[0]._1_1_,1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
              flat_blocks_,
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(value_type_conflict3 *)local_28);
  local_28[0] = 0x80;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_fill_assign
            (&(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
              denoised_,
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   denoised_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   denoised_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 1,local_28);
  local_28[0] = 0x80;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_fill_assign
            (&(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).data_,
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   denoised_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                   denoised_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 1,local_28);
  local_30.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 4;
  bVar1 = aom_noise_model_update
                    (&(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                      model_,(this->
                             super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                             data_ptr_raw_,
                     (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                     denoised_ptr_raw_,0x80,0x80,
                     (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                     strides_,(this->
                              super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>)
                              .chroma_sub_,
                     (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                     flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,0x10);
  local_38.data_._0_4_ = (uint)bVar1;
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            ((EqHelper *)local_28,"AOM_NOISE_STATUS_INTERNAL_ERROR","this->NoiseModelUpdate()",
             (anon_enum_32 *)&local_30,(int *)&local_38);
  if (local_28[0]._0_1_ == (EqHelper)0x0) {
    testing::Message::Message(&local_30);
    if (local_20 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x268,(char *)message);
    testing::internal::AssertHelper::operator=(&local_38,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_30.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_30.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_30.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_30.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(local_20);
  }
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateSuccessForZeroNoiseAllFlat) {
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  this->denoised_.assign(this->denoised_.size(), 128);
  this->data_.assign(this->denoised_.size(), 128);
  EXPECT_EQ(AOM_NOISE_STATUS_INTERNAL_ERROR, this->NoiseModelUpdate());
}